

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blt_mpi_smoke.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int globalValue;
  int commSize;
  int valueToSend;
  int commRank;
  int argc_local;
  char **argv_local;
  
  argc_local = argc;
  argv_local = argv;
  MPI_Init(&argc_local,&argv_local);
  commRank = -1;
  MPI_Comm_rank(&ompi_mpi_comm_world,&commRank);
  commSize = -1;
  MPI_Comm_size(&ompi_mpi_comm_world);
  globalValue = 0;
  valueToSend = 1;
  MPI_Reduce(&valueToSend,&globalValue,1,&ompi_mpi_int,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Finalize();
  if (commRank == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Count should be equal to rank size");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Count = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,globalValue);
    poVar1 = std::operator<<(poVar1,", Size = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,commSize);
    std::endl<char,std::char_traits<char>>(poVar1);
    if (globalValue != commSize) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
  // Initialize MPI and get rank and comm size
  MPI_Init(&argc, &argv);

  int commRank = -1;
  MPI_Comm_rank(MPI_COMM_WORLD, &commRank);
  int commSize = -1;
  MPI_Comm_size(MPI_COMM_WORLD, &commSize);

  // Do a basic mpi reduce to determine this actually works
  int globalValue = 0;
  int valueToSend = 1;
  MPI_Reduce(&valueToSend, &globalValue, 1, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);

  // Finalize MPI
  MPI_Finalize();

  if (commRank == 0)
  {
    std::cout << "Count should be equal to rank size" << std::endl;
    std::cout << "Count = " << globalValue << ", Size = " << commSize << std::endl;

    if (globalValue != commSize)
    {
      return 1;
    }
  }

  return 0;
}